

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  ostream *poVar5;
  tuple<void_(*)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data;
  ulong uVar6;
  bool bVar7;
  
  puVar1 = UnitTest::g_allTests_abi_cxx11_;
  puVar2 = DAT_001061b0;
  if (1 < argc) {
    uVar6 = 2;
    do {
      __s1 = argv[uVar6 - 1];
      iVar4 = strcmp(__s1,"--help");
      if ((iVar4 == 0) || (iVar4 = strcmp(__s1,"-h"), iVar4 == 0)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Usage: ");
        poVar5 = std::operator<<(poVar5,*argv);
        std::operator<<(poVar5," [-h|--help] [--only <testname>] [-v|--vim]\n");
        exit(0);
      }
      iVar4 = strcmp(__s1,"--only");
      if ((iVar4 == 0) && (uVar6 < (uint)argc)) {
        _DAT_00106190 = argv[uVar6];
      }
      else {
        iVar4 = strcmp(__s1,"--vim");
        if ((iVar4 == 0) || (iVar4 = strcmp(__s1,"-v"), iVar4 == 0)) {
          DAT_00106198 = 1;
        }
      }
      bVar7 = uVar6 != (uint)argc;
      uVar6 = uVar6 + 1;
      puVar1 = UnitTest::g_allTests_abi_cxx11_;
      puVar2 = DAT_001061b0;
    } while (bVar7);
  }
  for (; puVar3 = DAT_001061b0, puVar1 != DAT_001061b0; puVar1 = puVar1 + 5) {
    DAT_001061b0 = puVar2;
    UnitTest::UnitTester::runTestInt
              ((UnitTester *)&UnitTest::global_unit_test_object_,(TestFunction)puVar1[4],
               (char *)*puVar1);
    puVar2 = DAT_001061b0;
    DAT_001061b0 = puVar3;
  }
  DAT_001061b0 = puVar2;
  iVar4 = UnitTest::UnitTester::finalize((UnitTester *)&UnitTest::global_unit_test_object_);
  return iVar4;
}

Assistant:

static void initTest(int argc, char **argv) {  // {{{1
  for (int i = 1; i < argc; ++i) {
    if (0 == std::strcmp(argv[i], "--help") ||
        0 == std::strcmp(argv[i], "-h")) {
      std::cout << "Usage: " << argv[0] << " [-h|--help] [--only <testname>] [-v|--vim]\n";
      exit(0);
    } else if (0 == std::strcmp(argv[i], "--only") && i + 1 < argc) {
      global_unit_test_object_.only_name = argv[i + 1];
    } else if (0 == std::strcmp(argv[i], "--vim") ||
               0 == std::strcmp(argv[i], "-v")) {
      global_unit_test_object_.vim_lines = true;
    }
  }
}